

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

configuration loader_impl_initialize_configuration(char *tag)

{
  size_t sVar1;
  configuration pcVar2;
  char *in_RDI;
  size_t tag_size;
  char configuration_key [71];
  char local_58 [80];
  char *local_8;
  
  local_8 = in_RDI;
  sVar1 = strnlen(in_RDI,0x40);
  strncpy(local_58,local_8,sVar1 + 1);
  strncat(local_58,"_loader",0x47 - (sVar1 + 1));
  pcVar2 = (configuration)configuration_scope(local_58);
  return pcVar2;
}

Assistant:

configuration loader_impl_initialize_configuration(const loader_tag tag)
{
	static const char configuration_key_suffix[] = "_loader";
#define CONFIGURATION_KEY_SIZE ((size_t)sizeof(configuration_key_suffix) + LOADER_TAG_SIZE - 1)
	char configuration_key[CONFIGURATION_KEY_SIZE];

	/* Retrieve the configuration key: <tag>_loader */
	size_t tag_size = strnlen(tag, LOADER_TAG_SIZE) + 1;

	strncpy(configuration_key, tag, tag_size);

	strncat(configuration_key, configuration_key_suffix, CONFIGURATION_KEY_SIZE - tag_size);
#undef CONFIGURATION_KEY_SIZE

	return configuration_scope(configuration_key);
}